

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

void libxml_xmlXPathDestructNsNode(PyObject *cap)

{
  undefined8 uVar1;
  PyObject *cap_local;
  
  uVar1 = PyCapsule_GetPointer(cap,"xmlNsPtr");
  xmlXPathNodeSetFreeNs(uVar1);
  return;
}

Assistant:

static void
libxml_xmlXPathDestructNsNode(PyObject *cap)
#endif
{
#ifdef DEBUG
    fprintf(stderr, "libxml_xmlXPathDestructNsNode called %p\n", cap);
#endif
#if PY_VERSION_HEX < 0x02070000
    xmlXPathNodeSetFreeNs((xmlNsPtr) cap);
#else
    xmlXPathNodeSetFreeNs((xmlNsPtr) PyCapsule_GetPointer(cap, "xmlNsPtr"));
#endif
}